

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep.c
# Opt level: O1

void sprkStep_Free(ARKodeMem ark_mem)

{
  undefined8 *puVar1;
  
  if ((ark_mem != (ARKodeMem)0x0) &&
     (puVar1 = (undefined8 *)ark_mem->step_mem, puVar1 != (undefined8 *)0x0)) {
    if (puVar1[2] != 0) {
      arkFreeVec(ark_mem,(N_Vector *)(puVar1 + 2));
      puVar1[2] = (N_Vector)0x0;
    }
    if (puVar1[3] != 0) {
      arkFreeVec(ark_mem,(N_Vector *)(puVar1 + 3));
      puVar1[3] = (N_Vector)0x0;
    }
    ARKodeSPRKTable_Free((ARKodeSPRKTable)*puVar1);
    free(ark_mem->step_mem);
    ark_mem->step_mem = (void *)0x0;
  }
  return;
}

Assistant:

void sprkStep_Free(ARKodeMem ark_mem)
{
  ARKodeSPRKStepMem step_mem = NULL;

  /* nothing to do if ark_mem is already NULL */
  if (ark_mem == NULL) { return; }

  /* conditional frees on non-NULL SPRKStep module */
  if (ark_mem->step_mem != NULL)
  {
    step_mem = (ARKodeSPRKStepMem)ark_mem->step_mem;

    if (step_mem->sdata != NULL)
    {
      arkFreeVec(ark_mem, &step_mem->sdata);
      step_mem->sdata = NULL;
    }

    if (step_mem->yerr != NULL)
    {
      arkFreeVec(ark_mem, &step_mem->yerr);
      step_mem->yerr = NULL;
    }

    ARKodeSPRKTable_Free(step_mem->method);

    free(ark_mem->step_mem);
    ark_mem->step_mem = NULL;
  }
}